

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageImage::verify
          (RenderFragmentStorageImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  float *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  TextureLevel *pTVar8;
  IVec3 *pIVar9;
  uint *puVar10;
  uint *puVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vec4 local_d0;
  PixelBufferAccess local_c0;
  Vector<unsigned_int,_4> local_98;
  PixelBufferAccess local_88;
  undefined1 local_60 [8];
  Vec4 floatValue;
  UVec2 pos;
  deUint32 i;
  UVec4 value;
  int x;
  int y;
  deUint32 valuesPerPixel;
  UVec2 size;
  size_t param_2_local;
  VerifyRenderPassContext *context_local;
  RenderFragmentStorageImage *this_local;
  
  size.m_data = (uint  [2])sig;
  pTVar8 = VerifyRenderPassContext::getReferenceImage((VerifyRenderPassContext *)ctx);
  uVar2 = tcu::TextureLevel::getWidth(pTVar8);
  pTVar8 = VerifyRenderPassContext::getReferenceImage((VerifyRenderPassContext *)ctx);
  uVar3 = tcu::TextureLevel::getHeight(pTVar8);
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&y,uVar2,uVar3);
  uVar2 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&y);
  uVar3 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&y);
  uVar2 = de::max<unsigned_int>(1,uVar2 * uVar3 >> 0x10);
  value.m_data[3] = 0;
  while( true ) {
    pTVar8 = VerifyRenderPassContext::getReferenceTarget((VerifyRenderPassContext *)ctx);
    pIVar9 = tcu::TextureLevel::getSize(pTVar8);
    iVar4 = tcu::Vector<int,_3>::y(pIVar9);
    if (iVar4 <= (int)value.m_data[3]) break;
    value.m_data[2] = 0;
    while( true ) {
      pTVar8 = VerifyRenderPassContext::getReferenceTarget((VerifyRenderPassContext *)ctx);
      pIVar9 = tcu::TextureLevel::getSize(pTVar8);
      iVar4 = tcu::Vector<int,_3>::x(pIVar9);
      if (iVar4 <= (int)value.m_data[2]) break;
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)(pos.m_data + 1),value.m_data[2],value.m_data[3],0,0);
      for (pos.m_data[0] = 0; pos.m_data[0] < uVar2; pos.m_data[0] = pos.m_data[0] + 1) {
        puVar11 = pos.m_data + 1;
        puVar10 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)puVar11);
        uVar3 = *puVar10;
        puVar10 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)puVar11);
        uVar5 = *puVar10;
        puVar10 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)puVar11);
        uVar6 = *puVar10;
        puVar10 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)puVar11);
        uVar7 = *puVar10;
        puVar10 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)puVar11);
        uVar1 = *puVar10;
        puVar11 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)puVar11);
        this_00 = floatValue.m_data + 2;
        tcu::Vector<unsigned_int,_2>::Vector
                  ((Vector<unsigned_int,_2> *)this_00,uVar3 * 0x100 + (uVar5 ^ uVar6),
                   uVar7 * 0x100 + (uVar1 ^ *puVar11));
        pTVar8 = VerifyRenderPassContext::getReferenceImage((VerifyRenderPassContext *)ctx);
        tcu::TextureLevel::getAccess(&local_88,pTVar8);
        uVar3 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)this_00);
        uVar5 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&y);
        uVar6 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)this_00);
        uVar7 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&y);
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_60,(int)&local_88,uVar3 % uVar5,uVar6 % uVar7);
        fVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_60);
        fVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_60);
        fVar14 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_60);
        fVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_60);
        tcu::Vector<unsigned_int,_4>::Vector
                  (&local_98,(uint)(long)(fVar12 * 255.0),(uint)(long)(fVar13 * 255.0),
                   (uint)(long)(fVar14 * 255.0),(uint)(long)(fVar15 * 255.0));
      }
      pTVar8 = VerifyRenderPassContext::getReferenceTarget((VerifyRenderPassContext *)ctx);
      tcu::TextureLevel::getAccess(&local_c0,pTVar8);
      tcu::Vector<unsigned_int,_4>::asFloat((Vector<unsigned_int,_4> *)&local_e0);
      tcu::Vector<float,_4>::Vector(&local_f0,255.0);
      tcu::operator/((tcu *)&local_d0,&local_e0,&local_f0);
      tcu::PixelBufferAccess::setPixel(&local_c0,&local_d0,value.m_data[2],value.m_data[3],0);
      value.m_data[2] = value.m_data[2] + 1;
    }
    value.m_data[3] = value.m_data[3] + 1;
  }
  return value.m_data[3];
}

Assistant:

void RenderFragmentStorageImage::verify (VerifyRenderPassContext& context, size_t)
{
	const UVec2		size			= UVec2(context.getReferenceImage().getWidth(), context.getReferenceImage().getHeight());
	const deUint32	valuesPerPixel	= de::max<deUint32>(1u, (size.x() * size.y()) / (256u * 256u));

	for (int y = 0; y < context.getReferenceTarget().getSize().y(); y++)
	for (int x = 0; x < context.getReferenceTarget().getSize().x(); x++)
	{
		UVec4	value	= UVec4(x, y, 0u, 0u);

		for (deUint32 i = 0; i < valuesPerPixel; i++)
		{
			const UVec2	pos			= UVec2(value.z() * 256u + (value.x() ^ value.z()), value.w() * 256u + (value.y() ^ value.w()));
			const Vec4	floatValue	= context.getReferenceImage().getAccess().getPixel(pos.x() % size.x(), pos.y() % size.y());

			value = UVec4((deUint32)(floatValue.x() * 255.0f),
						  (deUint32)(floatValue.y() * 255.0f),
						  (deUint32)(floatValue.z() * 255.0f),
						  (deUint32)(floatValue.w() * 255.0f));

		}
		context.getReferenceTarget().getAccess().setPixel(value.asFloat() / Vec4(255.0f), x, y);
	}
}